

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_cell_tec(REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
                   REF_BOOL binary,FILE *file)

{
  long *plVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  REF_INT RVar10;
  int cell;
  char *pcVar11;
  size_t sVar12;
  size_t __n;
  REF_MPI ref_mpi;
  ulong uVar13;
  REF_INT ncell;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  int local_1c0;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  REF_MPI local_1a8;
  REF_BOOL local_19c;
  REF_NODE local_198;
  REF_INT local_18c;
  void *local_188;
  size_t local_180;
  REF_INT local_178 [28];
  REF_GLOB aRStack_108 [27];
  
  ref_mpi = ref_node->ref_mpi;
  uVar2 = ref_cell->node_per;
  uVar13 = (ulong)uVar2;
  local_19c = binary;
  local_198 = ref_node;
  local_180 = ncell_expected;
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"tet cell start");
  }
  local_1a8 = ref_mpi;
  if ((ref_mpi->id == 0) && (0 < ref_cell->max)) {
    RVar10 = 0;
    local_1b8 = 0;
    do {
      RVar3 = ref_cell_nodes(ref_cell,RVar10,local_178);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,local_198,RVar10,&local_1bc);
        if (uVar4 != 0) {
          pcVar11 = "part";
          uVar7 = 0x16a;
          goto LAB_0013a2a9;
        }
        ref_mpi = local_1a8;
        if (local_1a8->id == local_1bc) {
          if ((int)uVar2 < 1) {
            if (local_19c == 0) goto LAB_00139d3a;
          }
          else {
            uVar8 = 0;
            do {
              aRStack_108[uVar8] = l2c[local_178[uVar8]];
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
            if (local_19c == 0) {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  aRStack_108[uVar8] = aRStack_108[uVar8] + 1;
                  fprintf((FILE *)file," %ld");
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
LAB_00139d3a:
              fputc(10,(FILE *)file);
            }
            else if (0 < (int)uVar2) {
              uVar8 = 0;
              do {
                local_1c0 = (int)aRStack_108[uVar8];
                sVar5 = fwrite(&local_1c0,4,1,(FILE *)file);
                if (sVar5 != 1) {
                  pcVar11 = "int c2n";
                  __n = 1;
                  uVar7 = 0x173;
                  goto LAB_0013a09e;
                }
                uVar8 = uVar8 + 1;
              } while (uVar13 != uVar8);
            }
          }
          local_1b8 = local_1b8 + 1;
          ref_mpi = local_1a8;
        }
      }
      RVar10 = RVar10 + 1;
    } while (RVar10 < ref_cell->max);
  }
  else {
    local_1b8 = 0;
  }
  if (1 < ref_mpi->timing) {
    ref_mpi_stopwatch_stop(ref_mpi,"tet cell master");
  }
  if (ref_mpi->id == 0) {
    sVar12 = local_1b8;
    if (1 < ref_mpi->n) {
      local_198 = (REF_NODE)(uVar13 * 8);
      RVar10 = 1;
      do {
        uVar4 = ref_mpi_gather_recv(ref_mpi,&local_1c0,1,1,RVar10);
        if (uVar4 != 0) {
          pcVar11 = "recv ncell";
          uVar7 = 0x187;
          goto LAB_0013a2a9;
        }
        uVar4 = local_1c0 * uVar2;
        if ((int)uVar4 < 0) {
          uVar7 = 0x188;
          goto LAB_0013a169;
        }
        local_18c = RVar10;
        local_1b0 = malloc((ulong)uVar4 * 8);
        if (local_1b0 == (void *)0x0) {
          pcVar11 = "malloc c2n of REF_GLOB NULL";
          uVar7 = 0x188;
          goto LAB_0013a213;
        }
        pvVar6 = malloc((ulong)uVar4 << 2);
        RVar10 = local_18c;
        if (pvVar6 == (void *)0x0) {
          pcVar11 = "malloc int_c2n of REF_INT NULL";
          uVar7 = 0x189;
          goto LAB_0013a213;
        }
        local_188 = pvVar6;
        uVar4 = ref_mpi_gather_recv(local_1a8,local_1b0,uVar4,2,local_18c);
        if (uVar4 != 0) {
          pcVar11 = "recv c2n";
          uVar7 = 0x18c;
          goto LAB_0013a2a9;
        }
        uVar4 = local_1c0 * uVar2;
        if (local_19c == 0) {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              plVar1 = (long *)((long)local_1b0 + uVar8 * 8);
              *plVar1 = *plVar1 + 1;
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          if (0 < local_1c0) {
            lVar9 = 0;
            pvVar6 = local_1b0;
            local_1b8 = sVar12;
            do {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  fprintf((FILE *)file," %ld",*(undefined8 *)((long)pvVar6 + uVar8 * 8));
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              fputc(10,(FILE *)file);
              lVar9 = lVar9 + 1;
              pvVar6 = (void *)((long)pvVar6 + (long)local_198);
              sVar12 = local_1b8;
              RVar10 = local_18c;
            } while (lVar9 < local_1c0);
          }
        }
        else {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              *(undefined4 *)((long)local_188 + uVar8 * 4) =
                   *(undefined4 *)((long)local_1b0 + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          __n = (size_t)(int)uVar4;
          sVar5 = fwrite(local_188,4,__n,(FILE *)file);
          if (sVar5 != __n) {
            pcVar11 = "int c2n";
            uVar7 = 0x194;
            goto LAB_0013a09e;
          }
        }
        pvVar6 = local_1b0;
        sVar12 = sVar12 + (long)local_1c0;
        free(local_188);
        free(pvVar6);
        RVar10 = RVar10 + 1;
        ref_mpi = local_1a8;
      } while (RVar10 < local_1a8->n);
    }
LAB_00139fef:
    if (1 < ref_mpi->timing) {
      ref_mpi_stopwatch_stop(ref_mpi,"tet cell off");
    }
    if (ref_mpi->id != 0) {
      return 0;
    }
    if (sVar12 == local_180) {
      return 0;
    }
    pcVar11 = "cell count mismatch";
    uVar7 = 0x1c0;
    __n = local_180;
    sVar5 = sVar12;
LAB_0013a09e:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_cell_tec",pcVar11,__n,sVar5);
LAB_0013a170:
    uVar4 = 1;
  }
  else {
    local_1c0 = 0;
    if (0 < ref_cell->max) {
      RVar10 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,RVar10,local_178);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part(ref_cell,local_198,RVar10,&local_1bc);
          if (uVar4 != 0) {
            pcVar11 = "part";
            uVar7 = 0x1a8;
            goto LAB_0013a2a9;
          }
          ref_mpi = local_1a8;
          if (local_1a8->id == local_1bc) {
            local_1c0 = local_1c0 + 1;
          }
        }
        RVar10 = RVar10 + 1;
      } while (RVar10 < ref_cell->max);
    }
    uVar4 = ref_mpi_gather_send(ref_mpi,&local_1c0,1,1);
    if (uVar4 == 0) {
      if ((int)(local_1c0 * uVar2) < 0) {
        uVar7 = 0x1ac;
LAB_0013a169:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar7,"ref_gather_cell_tec","malloc c2n of REF_GLOB negative");
        goto LAB_0013a170;
      }
      pvVar6 = malloc((ulong)(local_1c0 * uVar2) << 3);
      if (pvVar6 == (void *)0x0) {
        pcVar11 = "malloc c2n of REF_GLOB NULL";
        uVar7 = 0x1ac;
LAB_0013a213:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar7,"ref_gather_cell_tec",pcVar11);
        return 2;
      }
      local_1c0 = 0;
      ref_mpi = local_1a8;
      if (0 < ref_cell->max) {
        cell = 0;
        local_1b0 = pvVar6;
        do {
          RVar3 = ref_cell_nodes(ref_cell,cell,local_178);
          if (RVar3 == 0) {
            uVar4 = ref_cell_part(ref_cell,local_198,cell,&local_1bc);
            if (uVar4 != 0) {
              pcVar11 = "part";
              uVar7 = 0x1af;
              goto LAB_0013a2a9;
            }
            ref_mpi = local_1a8;
            if (local_1a8->id == local_1bc) {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  *(REF_GLOB *)((long)local_1b0 + uVar8 * 8 + (long)(int)(local_1c0 * uVar2) * 8) =
                       l2c[local_178[uVar8]];
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              local_1c0 = local_1c0 + 1;
            }
          }
          cell = cell + 1;
          pvVar6 = local_1b0;
        } while (cell < ref_cell->max);
      }
      uVar4 = ref_mpi_gather_send(ref_mpi,pvVar6,uVar2 * local_1c0,2);
      sVar12 = local_1b8;
      if (uVar4 == 0) {
        free(pvVar6);
        goto LAB_00139fef;
      }
      pcVar11 = "send c2n";
      uVar7 = 0x1b7;
    }
    else {
      pcVar11 = "send ncell";
      uVar7 = 0x1ab;
    }
LAB_0013a2a9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_cell_tec",(ulong)uVar4,pcVar11);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_tec(REF_NODE ref_node,
                                              REF_CELL ref_cell,
                                              REF_LONG ncell_expected,
                                              REF_GLOB *l2c, REF_BOOL binary,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell start");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        if (binary) {
          for (node = 0; node < node_per; node++) {
            int int_node;
            int_node = (int)globals[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            globals[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell master");

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (1 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "tet cell off");

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}